

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_TIFFPredictor.hh
# Opt level: O2

void __thiscall Pl_TIFFPredictor::~Pl_TIFFPredictor(Pl_TIFFPredictor *this)

{
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_TIFFPredictor_002ac840;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->out).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            (&(this->previous).super__Vector_base<long_long,_std::allocator<long_long>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->cur_row).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  Pipeline::~Pipeline(&this->super_Pipeline);
  return;
}

Assistant:

~Pl_TIFFPredictor() override = default;